

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringalgorithms_p.h
# Opt level: O2

QByteArray *
QStringAlgorithms<const_QByteArray>::simplified_helper
          (QByteArray *__return_storage_ptr__,QByteArray *str)

{
  byte bVar1;
  long size;
  byte bVar2;
  Data *pDVar3;
  char *pcVar4;
  qsizetype qVar5;
  byte *pbVar6;
  byte *pbVar7;
  byte *pbVar8;
  byte *pbVar9;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  size = (str->d).size;
  if (size == 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      QArrayDataPointer<char>::QArrayDataPointer(&__return_storage_ptr__->d,&str->d);
      return __return_storage_ptr__;
    }
LAB_002d4fd4:
    __stack_chk_fail();
  }
  pbVar6 = (byte *)(str->d).ptr;
  pbVar8 = pbVar6 + size;
  local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.ptr = &DAT_aaaaaaaaaaaaaaaa;
  QByteArray::QByteArray((QByteArray *)&local_58,size,Uninitialized);
  bVar2 = 1;
  pbVar9 = (byte *)local_58.ptr;
  do {
    while (((pbVar7 = pbVar8, pbVar6 != pbVar8 && (pbVar7 = pbVar6, *pbVar6 < 0x40)) &&
           ((1L << (*pbVar6 & 0x3f) & 0x100003e00U) != 0))) {
      pbVar6 = pbVar6 + 1;
    }
    while( true ) {
      if (pbVar7 == pbVar8) {
        pbVar8 = (byte *)local_58.ptr;
        if ((pbVar9 != (byte *)local_58.ptr) && (pbVar8 = pbVar9 + -1, pbVar9[-1] != 0x20)) {
          pbVar8 = pbVar9;
        }
        if ((bool)((long)pbVar8 - (long)local_58.ptr == (str->d).size & bVar2)) {
          QArrayDataPointer<char>::QArrayDataPointer(&__return_storage_ptr__->d,&str->d);
        }
        else {
          QByteArray::resize((QByteArray *)&local_58,(long)pbVar8 - (long)local_58.ptr);
          qVar5 = local_58.size;
          pcVar4 = local_58.ptr;
          pDVar3 = local_58.d;
          local_58.d = (Data *)0x0;
          local_58.ptr = (char *)0x0;
          (__return_storage_ptr__->d).d = pDVar3;
          (__return_storage_ptr__->d).ptr = pcVar4;
          local_58.size = 0;
          (__return_storage_ptr__->d).size = qVar5;
        }
        QArrayDataPointer<char>::~QArrayDataPointer(&local_58);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          return __return_storage_ptr__;
        }
        goto LAB_002d4fd4;
      }
      bVar1 = *pbVar7;
      if ((bVar1 < 0x40) && ((1L << (bVar1 & 0x3f) & 0x100003e00U) != 0)) break;
      *pbVar9 = bVar1;
      pbVar9 = pbVar9 + 1;
      pbVar7 = pbVar7 + 1;
    }
    bVar2 = bVar2 & bVar1 == 0x20;
    *pbVar9 = 0x20;
    pbVar9 = pbVar9 + 1;
    pbVar6 = pbVar7;
  } while( true );
}

Assistant:

static inline StringType simplified_helper(StringType &str)
    {
        if (str.isEmpty())
            return str;
        const Char *src = str.cbegin();
        const Char *end = str.cend();
        NakedStringType result = isConst || !str.isDetached() ?
                                     StringType(str.size(), Qt::Uninitialized) :
                                     std::move(str);

        Char *dst = const_cast<Char *>(result.cbegin());
        Char *ptr = dst;
        bool unmodified = true;
        while (true) {
            while (src != end && isSpace(*src))
                ++src;
            while (src != end && !isSpace(*src))
                *ptr++ = *src++;
            if (src == end)
                break;
            if (*src != QChar::Space)
                unmodified = false;
            *ptr++ = QChar::Space;
        }
        if (ptr != dst && ptr[-1] == QChar::Space)
            --ptr;

        qsizetype newlen = ptr - dst;
        if (isConst && newlen == str.size() && unmodified) {
            // nothing happened, return the original
            return str;
        }
        result.resize(newlen);
        return result;
    }